

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

int lyv_data_unique(lyd_node *list)

{
  char **ppcVar1;
  uint uVar2;
  lys_node *plVar3;
  ly_ctx *ctx;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ly_set *set;
  char *pcVar7;
  hash_table *phVar8;
  long *plVar9;
  lyd_node *plVar10;
  size_t len;
  void *pvVar11;
  int UNUSED_mod;
  void *pvVar12;
  uint32_t uVar13;
  char *pcVar14;
  void *pvVar15;
  ulong uVar16;
  bool bVar17;
  char *local_70;
  char *path;
  void *local_60;
  long local_58;
  hash_table *local_50;
  char *id;
  void *local_40;
  void *local_38;
  
  if ((list->validity & 2) == 0) {
    return 0;
  }
  plVar3 = list->schema;
  ctx = plVar3->module->ctx;
  iVar5 = ly_vlog_build_path(LY_VLOG_LYD,list,&local_70,0,1);
  if (iVar5 != 0) {
    return -1;
  }
  set = lyd_find_path(list,local_70);
  free(local_70);
  if (set == (ly_set *)0x0) {
    return -1;
  }
  uVar2 = set->number;
  pcVar14 = (char *)(ulong)uVar2;
  id = (char *)plVar3;
  if (pcVar14 == (char *)0x0) {
LAB_0011f672:
    iVar5 = 0;
  }
  else {
    pcVar7 = (char *)0x0;
    do {
      ppcVar1 = &(set->set).s[(long)pcVar7]->dsc;
      *(byte *)ppcVar1 = *(byte *)ppcVar1 & 0xfd;
      pcVar7 = pcVar7 + 1;
    } while (pcVar14 != pcVar7);
    if (uVar2 == 2) {
      iVar5 = 0;
      iVar6 = lyv_list_uniq_equal((set->set).s,(set->set).s + 1,UNUSED_mod,(void *)0x0);
      if (iVar6 != 0) {
        ly_set_free(set);
        return 1;
      }
    }
    else {
      if (uVar2 < 3) goto LAB_0011f672;
      iVar5 = -1;
      do {
        if (uVar2 <= 0xffffffffU >> ((byte)iVar5 & 0x1f)) {
          pvVar11 = (void *)(ulong)plVar3->padding[3];
          local_40 = malloc((ulong)((uint)plVar3->padding[3] * 8));
          if (local_40 == (void *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyv_data_unique");
            goto LAB_0011f8a3;
          }
          local_38 = pvVar11;
          if (pvVar11 == (void *)0x0) goto LAB_0011f727;
          pvVar15 = (void *)0x1;
          goto LAB_0011f6de;
        }
        iVar5 = iVar5 + -1;
      } while (iVar5 != -0x20);
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
             ,0x123);
LAB_0011f8a3:
      iVar5 = -1;
    }
  }
  ly_set_free(set);
  pvVar15 = (void *)0x0;
LAB_0011f680:
  free(pvVar15);
  return iVar5;
LAB_0011f6de:
  phVar8 = lyht_new(1 << (-(byte)iVar5 & 0x1f),8,lyv_list_uniq_equal,pvVar15,0);
  *(hash_table **)((long)local_40 + (long)pvVar15 * 8 + -8) = phVar8;
  if (phVar8 != (hash_table *)0x0) goto code_r0x0011f70a;
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyv_data_unique");
LAB_0011f8cd:
  iVar5 = -1;
  pvVar11 = local_38;
  goto LAB_0011f8d7;
code_r0x0011f70a:
  bVar17 = pvVar15 == pvVar11;
  pvVar15 = (void *)((long)pvVar15 + 1);
  if (bVar17) goto code_r0x0011f71a;
  goto LAB_0011f6de;
code_r0x0011f71a:
  pcVar14 = (char *)(ulong)set->number;
  if (set->number == 0) {
    iVar5 = 0;
    pvVar11 = local_38;
  }
  else {
LAB_0011f727:
    pcVar7 = (char *)0x0;
    pvVar11 = local_38;
    do {
      if (pvVar11 != (void *)0x0) {
        pvVar11 = (void *)0x0;
        path = pcVar7;
        do {
          local_50 = (hash_table *)0x0;
          local_58 = (long)pvVar11 * 0x10;
          local_60 = pvVar11;
          if (*(char *)(*(long *)(id + 0x90) + 8 + local_58) != '\0') {
            plVar9 = (long *)(*(long *)(id + 0x90) + local_58);
            uVar16 = 0;
            uVar13 = 0;
            do {
              pcVar4 = id;
              pcVar14 = path;
              plVar10 = resolve_data_descendant_schema_nodeid
                                  (*(char **)(*plVar9 + uVar16 * 8),
                                   (lyd_node *)(set->set).s[(long)path]->parent);
              if (plVar10 == (lyd_node *)0x0) {
                iVar5 = lyd_get_unique_default
                                  (*(char **)(*(long *)(*(long *)(pcVar4 + 0x90) + local_58) +
                                             uVar16 * 8),(lyd_node *)(set->set).s[(long)pcVar14],
                                   (char **)&local_50);
                if (iVar5 != 0) goto LAB_0011f8cd;
              }
              else {
                local_50 = plVar10->ht;
              }
              phVar8 = local_50;
              if (local_50 == (hash_table *)0x0) goto LAB_0011f854;
              len = strlen((char *)local_50);
              uVar13 = dict_hash_multi(uVar13,(char *)phVar8,len);
              uVar16 = uVar16 + 1;
              plVar9 = (long *)(*(long *)(id + 0x90) + local_58);
            } while (uVar16 < *(byte *)(*(long *)(id + 0x90) + 8 + local_58));
            if (local_50 != (hash_table *)0x0) {
              uVar13 = dict_hash_multi(uVar13,(char *)0x0,0);
              iVar5 = lyht_insert(*(hash_table **)((long)local_40 + (long)local_60 * 8),
                                  (set->set).s + (long)pcVar7,uVar13,(void **)0x0);
              if (iVar5 != 0) {
                iVar5 = 1;
                pvVar11 = local_38;
                goto LAB_0011f8d7;
              }
            }
          }
LAB_0011f854:
          pvVar11 = (void *)((long)local_60 + 1);
        } while (pvVar11 != local_38);
        pcVar14 = (char *)(ulong)set->number;
        pcVar7 = path;
        pvVar11 = local_38;
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 < pcVar14);
    iVar5 = 0;
  }
LAB_0011f8d7:
  ly_set_free(set);
  pvVar15 = local_40;
  if (pvVar11 != (void *)0x0) {
    pvVar12 = (void *)0x0;
    do {
      phVar8 = *(hash_table **)((long)pvVar15 + (long)pvVar12 * 8);
      if (phVar8 == (hash_table *)0x0) break;
      lyht_free(phVar8);
      pvVar12 = (void *)((long)pvVar12 + 1);
    } while (pvVar11 != pvVar12);
  }
  goto LAB_0011f680;
}

Assistant:

int
lyv_data_unique(struct lyd_node *list)
{
    struct lyd_node *diter;
    struct ly_set *set;
    uint32_t i, j, n = 0;
    int ret = 0;
    uint32_t hash, u, usize = 0;
    struct hash_table **uniqtables = NULL;
    const char *id;
    char *path;
    struct lys_node_list *slist;
    struct ly_ctx *ctx = list->schema->module->ctx;

    if (!(list->validity & LYD_VAL_UNIQUE)) {
        /* validated sa part of another instance validation */
        return 0;
    }

    slist = (struct lys_node_list *)list->schema;

    /* get all list instances */
    if (ly_vlog_build_path(LY_VLOG_LYD, list, &path, 0, 1)) {
        return -1;
    }
    set = lyd_find_path(list, path);
    free(path);
    if (!set) {
        return -1;
    }

    for (i = 0; i < set->number; ++i) {
        /* remove the flag */
        set->set.d[i]->validity &= ~LYD_VAL_UNIQUE;
    }

    if (set->number == 2) {
        /* simple comparison */
        if (lyv_list_uniq_equal(&set->set.d[0], &set->set.d[1], 0, (void *)0)) {
            /* instance duplication */
            ly_set_free(set);
            return 1;
        }
    } else if (set->number > 2) {
        /* use hashes for comparison */
        /* first, allocate the table, the size depends on number of items in the set */
        for (u = 31; u > 0; u--) {
            usize = set->number << u;
            usize = usize >> u;
            if (usize == set->number) {
                break;
            }
        }
        if (u == 0) {
            LOGINT(ctx);
            ret = -1;
            goto cleanup;
        } else {
            u = 32 - u;
            usize = 1 << u;
        }

        n = slist->unique_size;
        uniqtables = malloc(n * sizeof *uniqtables);
        if (!uniqtables) {
            LOGMEM(ctx);
            ret = -1;
            n = 0;
            goto cleanup;
        }
        for (j = 0; j < n; j++) {
            uniqtables[j] = lyht_new(usize, sizeof(struct lyd_node *), lyv_list_uniq_equal, (void *)(j + 1L), 0);
            if (!uniqtables[j]) {
                LOGMEM(ctx);
                ret = -1;
                goto cleanup;
            }
        }

        for (u = 0; u < set->number; u++) {
            /* loop for unique - get the hash for the instances */
            for (j = 0; j < n; j++) {
                id = NULL;
                for (i = hash = 0; i < slist->unique[j].expr_size; i++) {
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[j].expr[i], set->set.d[u]->child);
                    if (diter) {
                        id = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        if (lyd_get_unique_default(slist->unique[j].expr[i], set->set.d[u], &id)) {
                            ret = -1;
                            goto cleanup;
                        }
                    }
                    if (!id) {
                        /* unique item not present nor has default value */
                        break;
                    }
                    hash = dict_hash_multi(hash, id, strlen(id));
                }
                if (!id) {
                    /* skip this list instance since its unique set is incomplete */
                    continue;
                }

                /* finish the hash value */
                hash = dict_hash_multi(hash, NULL, 0);

                /* insert into the hashtable */
                if (lyht_insert(uniqtables[j], &set->set.d[u], hash, NULL)) {
                    ret = 1;
                    goto cleanup;
                }
            }
        }
    }

cleanup:
    ly_set_free(set);
    for (j = 0; j < n; j++) {
        if (!uniqtables[j]) {
            /* failed when allocating uniquetables[j], following j are not allocated */
            break;
        }
        lyht_free(uniqtables[j]);
    }
    free(uniqtables);

    return ret;
}